

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O0

application_protocol * init_app_proto(char *proto)

{
  int iVar1;
  char local_68 [8];
  char hostname [64];
  int i;
  application_protocol *app_proto;
  char *proto_local;
  
  proto_local = (char *)malloc(0x20);
  if ((application_protocol *)proto_local != (application_protocol *)0x0) {
    memset(random_char,0x78,0x200000);
    iVar1 = strncmp(proto,"echo",4);
    if (iVar1 == 0) {
      echo_init(proto,(application_protocol *)proto_local);
    }
    else {
      iVar1 = strncmp(proto,"synthetic",9);
      if (iVar1 == 0) {
        synthetic_init(proto,(application_protocol *)proto_local);
      }
      else {
        iVar1 = strncmp(proto,"redis",5);
        if (iVar1 == 0) {
          redis_init(proto,(application_protocol *)proto_local);
        }
        else {
          iVar1 = strncmp(proto,"memcache",8);
          if (iVar1 == 0) {
            memcache_init(proto,(application_protocol *)proto_local);
          }
          else {
            iVar1 = strncmp(proto,"http",4);
            if (iVar1 == 0) {
              iVar1 = http_proto_init(proto,(application_protocol *)proto_local);
              if (iVar1 != 0) {
                proto_local = (char *)0x0;
              }
            }
            else {
              iVar1 = strncmp(proto,"stss",4);
              if (iVar1 == 0) {
                stss_init(proto,(application_protocol *)proto_local);
              }
              else {
                gethostname(local_68,0x40);
                fprintf(_stderr,"[%s] ",local_68);
                fprintf(_stderr,"Unknown application protocol\n");
                proto_local = (char *)0x0;
              }
            }
          }
        }
      }
    }
    return (application_protocol *)proto_local;
  }
  __assert_fail("app_proto",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                ,0x10a,"struct application_protocol *init_app_proto(char *)");
}

Assistant:

struct application_protocol *init_app_proto(char *proto)
{
	struct application_protocol *app_proto;

	app_proto = malloc(sizeof(struct application_protocol));
	assert(app_proto);

	// Init random char
	memset(random_char, 'x', MAX_VAL_SIZE);

	if (strncmp(proto, "echo", 4) == 0)
		echo_init(proto, app_proto);
	else if (strncmp(proto, "synthetic", 9) == 0)
		synthetic_init(proto, app_proto);
	else if (strncmp(proto, "redis", 5) == 0)
		redis_init(proto, app_proto);
	else if (strncmp(proto, "memcache", 8) == 0)
		memcache_init(proto, app_proto);
	else if (strncmp(proto, "http", 4) == 0) {
		int i = http_proto_init(proto, app_proto);
		if (i != 0)
			return NULL;
	} else if (strncmp(proto, "stss", 4) == 0)
		stss_init(proto, app_proto);
	else {
		lancet_fprintf(stderr, "Unknown application protocol\n");
		return NULL;
	}

	return app_proto;
}